

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::anon_unknown_26::ANSIColourImpl::use(ANSIColourImpl *this,Code _colourCode)

{
  string *msg;
  undefined4 in_ESI;
  long in_RDI;
  anon_class_8_1_ba1d6aae setColour;
  SourceLineInfo *in_stack_fffffffffffffef8;
  ReusableStringStream *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff20;
  SourceLineInfo local_a8 [5];
  SourceLineInfo local_58 [4];
  undefined8 local_18;
  undefined4 local_c;
  
  local_c = in_ESI;
  local_18 = (**(code **)(**(long **)(in_RDI + 8) + 0x10))();
  switch(local_c) {
  case 0:
  case 1:
    use::anon_class_8_1_ba1d6aae::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    break;
  case 2:
    use::anon_class_8_1_ba1d6aae::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    break;
  case 3:
    use::anon_class_8_1_ba1d6aae::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    break;
  case 4:
    use::anon_class_8_1_ba1d6aae::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    break;
  case 5:
    use::anon_class_8_1_ba1d6aae::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    break;
  case 6:
    use::anon_class_8_1_ba1d6aae::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    break;
  case 7:
    use::anon_class_8_1_ba1d6aae::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    break;
  default:
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff00);
    SourceLineInfo::SourceLineInfo
              (local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp"
               ,0xdf3);
    msg = (string *)
          ReusableStringStream::operator<<(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff00,(char (*) [26])in_stack_fffffffffffffef8);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff00,(char (*) [25])in_stack_fffffffffffffef8);
    ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffef8);
    throw_logic_error(msg);
  case 0x10:
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff00);
    SourceLineInfo::SourceLineInfo
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp"
               ,0xdf2);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff00,(char (*) [26])in_stack_fffffffffffffef8);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff00,(char (*) [13])in_stack_fffffffffffffef8);
    ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffef8);
    throw_logic_error(in_stack_ffffffffffffff20);
  case 0x11:
    use::anon_class_8_1_ba1d6aae::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    break;
  case 0x12:
    use::anon_class_8_1_ba1d6aae::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    break;
  case 0x13:
    use::anon_class_8_1_ba1d6aae::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    break;
  case 0x16:
    use::anon_class_8_1_ba1d6aae::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
    break;
  case 0x17:
    use::anon_class_8_1_ba1d6aae::operator()
              ((anon_class_8_1_ba1d6aae *)in_stack_ffffffffffffff00,
               (char *)in_stack_fffffffffffffef8);
  }
  return;
}

Assistant:

void use( Colour::Code _colourCode ) const override {
            auto setColour = [&out =
                                  m_stream->stream()]( char const* escapeCode ) {
                // The escape sequence must be flushed to console, otherwise
                // if stdin and stderr are intermixed, we'd get accidentally
                // coloured output.
                out << '\033' << escapeCode << std::flush;
            };
            switch( _colourCode ) {
                case Colour::None:
                case Colour::White:     return setColour( "[0m" );
                case Colour::Red:       return setColour( "[0;31m" );
                case Colour::Green:     return setColour( "[0;32m" );
                case Colour::Blue:      return setColour( "[0;34m" );
                case Colour::Cyan:      return setColour( "[0;36m" );
                case Colour::Yellow:    return setColour( "[0;33m" );
                case Colour::Grey:      return setColour( "[1;30m" );

                case Colour::LightGrey:     return setColour( "[0;37m" );
                case Colour::BrightRed:     return setColour( "[1;31m" );
                case Colour::BrightGreen:   return setColour( "[1;32m" );
                case Colour::BrightWhite:   return setColour( "[1;37m" );
                case Colour::BrightYellow:  return setColour( "[1;33m" );

                case Colour::Bright: CATCH_INTERNAL_ERROR( "not a colour" );
                default: CATCH_INTERNAL_ERROR( "Unknown colour requested" );
            }
        }